

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void singlevar(LexState *ls,expdesc *var)

{
  TString *n;
  undefined1 local_60 [8];
  expdesc key;
  FuncState *fs;
  TString *varname;
  expdesc *var_local;
  LexState *ls_local;
  
  n = str_checkname(ls);
  key._48_8_ = ls->fs;
  singlevaraux((FuncState *)key._48_8_,n,var,1);
  if (var->k == VVOID) {
    memset(local_60,0,0x38);
    key.t = -1;
    key.usertype._0_4_ = 0xffffffff;
    singlevaraux((FuncState *)key._48_8_,ls->envn,var,1);
    if (var->k == VVOID) {
      __assert_fail("var->k != VVOID",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x26c,"void singlevar(LexState *, expdesc *)");
    }
    codestring(ls,(expdesc *)local_60,n);
    luaK_indexed((FuncState *)key._48_8_,var,(expdesc *)local_60);
  }
  return;
}

Assistant:

static void singlevar (LexState *ls, expdesc *var) {
  TString *varname = str_checkname(ls);
  FuncState *fs = ls->fs;
  singlevaraux(fs, varname, var, 1);
  if (var->k == VVOID) {  /* global name? */
    expdesc key = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
    singlevaraux(fs, ls->envn, var, 1);  /* get environment variable */
    lua_assert(var->k != VVOID);  /* this one must exist */
    codestring(ls, &key, varname);  /* key is variable name */
    luaK_indexed(fs, var, &key);  /* env[varname] */
  }
}